

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O1

void __thiscall Position::CaptureMaterial(Position *this,Position *position,Square *captureSquare)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  int iVar3;
  Piece *pPiece;
  
  iVar1 = (*(this->m_Board).super_BoardPieceSquare.super_BoardHashing.super_BoardBase.
            _vptr_BoardBase[1])
                    (&this->m_Board,(ulong)(uint)(captureSquare->j * 8 + captureSquare->i));
  pPiece = (Piece *)CONCAT44(extraout_var,iVar1);
  iVar1 = position->m_nMaterialScore;
  iVar2 = (**pPiece->_vptr_Piece)(pPiece);
  iVar3 = -iVar2;
  if (this->m_ColorToMove != false) {
    iVar3 = iVar2;
  }
  this->m_nMaterialScore = iVar3 + iVar1;
  if (pPiece != &None.super_Piece) {
    Material::CaptureMaterial(&this->m_Material,pPiece);
    this->m_nPlySinceCaptureOrPawnMove = 1;
  }
  iVar1 = captureSquare->i;
  if ((iVar1 == A1.i) && (captureSquare->j == A1.j)) {
    this->m_bVirginA1 = false;
  }
  if ((iVar1 == A8.i) && (captureSquare->j == A8.j)) {
    this->m_bVirginA8 = false;
  }
  if ((iVar1 == H1.i) && (captureSquare->j == H1.j)) {
    this->m_bVirginH1 = false;
  }
  if ((iVar1 == H8.i) && (captureSquare->j == H8.j)) {
    this->m_bVirginH8 = false;
  }
  return;
}

Assistant:

void CaptureMaterial( const Position &position, const Square &captureSquare )
    {
        const Piece *pCaptured = m_Board.Get( captureSquare );
        m_nMaterialScore = position.GetScore() +
                           pCaptured->PieceValue() * GetColorBias();

        if ( pCaptured != &None )
        {
            m_Material.CaptureMaterial( pCaptured );
            m_nPlySinceCaptureOrPawnMove = 1;
        }

        if ( captureSquare == A1 )
            m_bVirginA1 = false;

        if ( captureSquare == A8 )
            m_bVirginA8 = false;

        if ( captureSquare == H1 )
            m_bVirginH1 = false;

        if ( captureSquare == H8 )
            m_bVirginH8 = false;
    }